

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter_Postprocess.cpp
# Opt level: O1

void __thiscall
Assimp::X3DImporter::Postprocess_BuildLight
          (X3DImporter *this,CX3DImporter_NodeElement *pNodeElement,
          list<aiLight_*,_std::allocator<aiLight_*>_> *pSceneLightList)

{
  size_t *psVar1;
  float fVar2;
  EType EVar3;
  ulong __n;
  _List_node_base *p_Var4;
  _List_node_base *p_Var5;
  runtime_error *this_00;
  long *plVar6;
  long *plVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  aiMatrix4x4 transform_matr;
  aiMatrix4x4 local_c8;
  long *local_88;
  long local_80;
  long local_78;
  long lStack_70;
  string local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  PostprocessHelper_Matrix_GlobalToCurrent(&local_c8,this);
  p_Var4 = (_List_node_base *)operator_new(0x46c);
  *(undefined4 *)&p_Var4->_M_next = 0;
  *(undefined1 *)((long)&p_Var4->_M_next + 4) = 0;
  memset((void *)((long)&p_Var4->_M_next + 5),0x1b,0x3ff);
  *(undefined8 *)((long)&p_Var4[0x40]._M_next + 4) = 0;
  *(undefined8 *)((long)&p_Var4[0x40]._M_prev + 4) = 0;
  *(undefined8 *)((long)&p_Var4[0x41]._M_next + 4) = 0;
  *(undefined8 *)((long)&p_Var4[0x41]._M_prev + 4) = 0;
  p_Var4[0x42]._M_next = (_List_node_base *)0x0;
  p_Var4[0x42]._M_prev = (_List_node_base *)0x0;
  *(undefined4 *)&p_Var4[0x43]._M_next = 0x3f800000;
  *(undefined8 *)((long)&p_Var4[0x43]._M_next + 4) = 0;
  *(undefined8 *)((long)&p_Var4[0x43]._M_prev + 4) = 0;
  *(undefined8 *)((long)&p_Var4[0x44]._M_next + 4) = 0;
  *(undefined8 *)((long)&p_Var4[0x44]._M_prev + 4) = 0;
  *(undefined8 *)((long)&p_Var4[0x45]._M_next + 4) = 0;
  *(undefined8 *)((long)&p_Var4[0x45]._M_prev + 4) = 0x40c90fdb40c90fdb;
  *(undefined8 *)((long)&p_Var4[0x46]._M_next + 4) = 0;
  __n = (pNodeElement->ID)._M_string_length;
  if (__n < 0x400) {
    *(int *)&p_Var4->_M_next = (int)__n;
    memcpy((void *)((long)&p_Var4->_M_next + 4),(pNodeElement->ID)._M_dataplus._M_p,__n);
    *(undefined1 *)((long)&p_Var4->_M_next + __n + 4) = 0;
  }
  fVar2 = *(float *)&pNodeElement[1]._vptr_CX3DImporter_NodeElement;
  fVar8 = *(float *)((long)&pNodeElement[1]._vptr_CX3DImporter_NodeElement + 4);
  fVar9 = (float)pNodeElement[1].Type;
  fVar10 = *(float *)&pNodeElement[1].field_0xc;
  *(float *)&p_Var4[0x45]._M_next = fVar2 * fVar8;
  *(float *)((long)&p_Var4[0x45]._M_next + 4) = fVar2 * fVar9;
  *(float *)&p_Var4[0x45]._M_prev = fVar2 * fVar10;
  fVar2 = *(float *)&pNodeElement[1].ID.field_2;
  fVar8 = fVar8 * fVar2;
  fVar9 = fVar9 * fVar2;
  fVar10 = fVar10 * fVar2;
  *(float *)&p_Var4[0x43]._M_prev = fVar8;
  *(float *)((long)&p_Var4[0x43]._M_prev + 4) = fVar9;
  *(float *)&p_Var4[0x44]._M_next = fVar10;
  *(float *)((long)&p_Var4[0x44]._M_next + 4) = fVar8;
  *(float *)&p_Var4[0x44]._M_prev = fVar9;
  *(float *)((long)&p_Var4[0x44]._M_prev + 4) = fVar10;
  EVar3 = pNodeElement->Type;
  if (EVar3 == ENET_SpotLight) {
    *(undefined4 *)((long)&p_Var4[0x40]._M_next + 4) = 3;
    *(undefined4 *)&p_Var4[0x41]._M_next =
         *(undefined4 *)
          &pNodeElement[1].Child.
           super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
           ._M_impl._M_node.super__List_node_base._M_next;
    p_Var4[0x40]._M_prev = (_List_node_base *)pNodeElement[1].Parent;
    fVar2 = *(float *)&p_Var4[0x40]._M_prev;
    fVar8 = *(float *)((long)&p_Var4[0x40]._M_prev + 4);
    fVar9 = *(float *)&p_Var4[0x41]._M_next;
    p_Var4[0x40]._M_prev =
         (_List_node_base *)
         CONCAT44(local_c8.b3 * fVar9 + local_c8.b1 * fVar2 + fVar8 * local_c8.b2 + local_c8.b4,
                  local_c8.a3 * fVar9 + local_c8.a1 * fVar2 + local_c8.a2 * fVar8 + local_c8.a4);
    *(float *)&p_Var4[0x41]._M_next =
         fVar9 * local_c8.c3 + fVar2 * local_c8.c1 + fVar8 * local_c8.c2 + local_c8.c4;
    *(int *)((long)&p_Var4[0x41]._M_prev + 4) = (int)pNodeElement[1].ID._M_string_length;
    *(pointer *)((long)&p_Var4[0x41]._M_next + 4) = pNodeElement[1].ID._M_dataplus._M_p;
    fVar2 = *(float *)((long)&p_Var4[0x41]._M_next + 4);
    fVar8 = *(float *)&p_Var4[0x41]._M_prev;
    fVar9 = *(float *)((long)&p_Var4[0x41]._M_prev + 4);
    *(ulong *)((long)&p_Var4[0x41]._M_next + 4) =
         CONCAT44(local_c8.b3 * fVar9 + local_c8.b1 * fVar2 + local_c8.b2 * fVar8 + local_c8.b4,
                  local_c8.a3 * fVar9 + local_c8.a1 * fVar2 + local_c8.a2 * fVar8 + local_c8.a4);
    *(float *)((long)&p_Var4[0x41]._M_prev + 4) =
         local_c8.c3 * fVar9 + local_c8.c1 * fVar2 + local_c8.c2 * fVar8 + local_c8.c4;
    *(undefined4 *)((long)&p_Var4[0x42]._M_prev + 4) =
         *(undefined4 *)((long)&pNodeElement[1].ID.field_2 + 4);
    *(undefined4 *)&p_Var4[0x43]._M_next = *(undefined4 *)((long)&pNodeElement[1].ID.field_2 + 8);
    *(undefined4 *)((long)&p_Var4[0x43]._M_next + 4) =
         *(undefined4 *)((long)&pNodeElement[1].ID.field_2 + 0xc);
    *(undefined4 *)((long)&p_Var4[0x45]._M_prev + 4) =
         *(undefined4 *)
          &pNodeElement[1].Child.
           super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
           ._M_impl._M_node.super__List_node_base._M_prev;
    *(undefined4 *)&p_Var4[0x46]._M_next =
         *(undefined4 *)
          ((long)&pNodeElement[1].Child.
                  super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                  ._M_impl._M_node.super__List_node_base._M_prev + 4);
  }
  else if (EVar3 == ENET_PointLight) {
    *(undefined4 *)((long)&p_Var4[0x40]._M_next + 4) = 2;
    p_Var4[0x40]._M_prev = (_List_node_base *)pNodeElement[1].Parent;
    *(undefined4 *)&p_Var4[0x41]._M_next =
         *(undefined4 *)
          &pNodeElement[1].Child.
           super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
           ._M_impl._M_node.super__List_node_base._M_next;
    fVar2 = *(float *)&p_Var4[0x40]._M_prev;
    fVar8 = *(float *)((long)&p_Var4[0x40]._M_prev + 4);
    fVar9 = *(float *)&p_Var4[0x41]._M_next;
    p_Var4[0x40]._M_prev =
         (_List_node_base *)
         CONCAT44(local_c8.b3 * fVar9 + local_c8.b1 * fVar2 + local_c8.b2 * fVar8 + local_c8.b4,
                  local_c8.a3 * fVar9 + local_c8.a1 * fVar2 + local_c8.a2 * fVar8 + local_c8.a4);
    *(float *)&p_Var4[0x41]._M_next =
         fVar9 * local_c8.c3 + fVar2 * local_c8.c1 + fVar8 * local_c8.c2 + local_c8.c4;
    *(undefined4 *)((long)&p_Var4[0x42]._M_prev + 4) =
         *(undefined4 *)((long)&pNodeElement[1].ID.field_2 + 4);
    *(undefined4 *)&p_Var4[0x43]._M_next = *(undefined4 *)((long)&pNodeElement[1].ID.field_2 + 8);
    *(undefined4 *)((long)&p_Var4[0x43]._M_next + 4) =
         *(undefined4 *)((long)&pNodeElement[1].ID.field_2 + 0xc);
  }
  else {
    if (EVar3 != ENET_DirectionalLight) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      to_string<CX3DImporter_NodeElement::EType>(&local_68,pNodeElement->Type);
      std::operator+(&local_48,"Postprocess_BuildLight. Unknown type of light: ",&local_68);
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_48);
      local_88 = (long *)*plVar6;
      plVar7 = plVar6 + 2;
      if (local_88 == plVar7) {
        local_78 = *plVar7;
        lStack_70 = plVar6[3];
        local_88 = &local_78;
      }
      else {
        local_78 = *plVar7;
      }
      local_80 = plVar6[1];
      *plVar6 = (long)plVar7;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      std::runtime_error::runtime_error(this_00,(string *)&local_88);
      *(undefined ***)this_00 = &PTR__runtime_error_008e3168;
      __cxa_throw(this_00,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    *(undefined4 *)((long)&p_Var4[0x40]._M_next + 4) = 1;
    *(pointer *)((long)&p_Var4[0x41]._M_next + 4) = pNodeElement[1].ID._M_dataplus._M_p;
    *(int *)((long)&p_Var4[0x41]._M_prev + 4) = (int)pNodeElement[1].ID._M_string_length;
    fVar2 = *(float *)((long)&p_Var4[0x41]._M_next + 4);
    fVar8 = *(float *)&p_Var4[0x41]._M_prev;
    fVar9 = *(float *)((long)&p_Var4[0x41]._M_prev + 4);
    *(ulong *)((long)&p_Var4[0x41]._M_next + 4) =
         CONCAT44(local_c8.b3 * fVar9 + local_c8.b1 * fVar2 + local_c8.b2 * fVar8 + local_c8.b4,
                  local_c8.a3 * fVar9 + local_c8.a1 * fVar2 + local_c8.a2 * fVar8 + local_c8.a4);
    *(float *)((long)&p_Var4[0x41]._M_prev + 4) =
         fVar9 * local_c8.c3 + fVar2 * local_c8.c1 + fVar8 * local_c8.c2 + local_c8.c4;
  }
  p_Var5 = (_List_node_base *)operator_new(0x18);
  p_Var5[1]._M_next = p_Var4;
  std::__detail::_List_node_base::_M_hook(p_Var5);
  psVar1 = &(pSceneLightList->super__List_base<aiLight_*,_std::allocator<aiLight_*>_>)._M_impl.
            _M_node._M_size;
  *psVar1 = *psVar1 + 1;
  return;
}

Assistant:

void X3DImporter::Postprocess_BuildLight(const CX3DImporter_NodeElement& pNodeElement, std::list<aiLight*>& pSceneLightList) const
{
    const CX3DImporter_NodeElement_Light& ne = *( ( CX3DImporter_NodeElement_Light* ) &pNodeElement );
    aiMatrix4x4 transform_matr = PostprocessHelper_Matrix_GlobalToCurrent();
    aiLight* new_light = new aiLight;

	new_light->mName = ne.ID;
	new_light->mColorAmbient = ne.Color * ne.AmbientIntensity;
	new_light->mColorDiffuse = ne.Color * ne.Intensity;
	new_light->mColorSpecular = ne.Color * ne.Intensity;
	switch(pNodeElement.Type)
	{
		case CX3DImporter_NodeElement::ENET_DirectionalLight:
			new_light->mType = aiLightSource_DIRECTIONAL;
			new_light->mDirection = ne.Direction, new_light->mDirection *= transform_matr;

			break;
		case CX3DImporter_NodeElement::ENET_PointLight:
			new_light->mType = aiLightSource_POINT;
			new_light->mPosition = ne.Location, new_light->mPosition *= transform_matr;
			new_light->mAttenuationConstant = ne.Attenuation.x;
			new_light->mAttenuationLinear = ne.Attenuation.y;
			new_light->mAttenuationQuadratic = ne.Attenuation.z;

			break;
		case CX3DImporter_NodeElement::ENET_SpotLight:
			new_light->mType = aiLightSource_SPOT;
			new_light->mPosition = ne.Location, new_light->mPosition *= transform_matr;
			new_light->mDirection = ne.Direction, new_light->mDirection *= transform_matr;
			new_light->mAttenuationConstant = ne.Attenuation.x;
			new_light->mAttenuationLinear = ne.Attenuation.y;
			new_light->mAttenuationQuadratic = ne.Attenuation.z;
			new_light->mAngleInnerCone = ne.BeamWidth;
			new_light->mAngleOuterCone = ne.CutOffAngle;

			break;
		default:
			throw DeadlyImportError("Postprocess_BuildLight. Unknown type of light: " + to_string(pNodeElement.Type) + ".");
	}

	pSceneLightList.push_back(new_light);
}